

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::DecorationManager::WhileEachDecoration
          (DecorationManager *this,uint32_t id,uint32_t decoration,
          function<bool_(const_spvtools::opt::Instruction_&)> *f)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  uint32_t uVar3;
  pointer ppIVar4;
  _Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  local_48;
  
  InternalGetDecorationsFor<spvtools::opt::Instruction_const*>
            ((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
              *)&local_48,this,id,true);
  for (ppIVar4 = local_48._M_impl.super__Vector_impl_data._M_start;
      ppIVar4 != local_48._M_impl.super__Vector_impl_data._M_finish; ppIVar4 = ppIVar4 + 1) {
    this_00 = *ppIVar4;
    OVar1 = this_00->opcode_;
    if (((OVar1 == OpDecorate) || (OVar1 == OpDecorateString)) || (OVar1 == OpDecorateId)) {
      uVar3 = 1;
    }
    else {
      if (OVar1 != OpMemberDecorate) {
        __assert_fail("false && \"Unexpected decoration instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x1e0,
                      "bool spvtools::opt::analysis::DecorationManager::WhileEachDecoration(uint32_t, uint32_t, std::function<bool (const Instruction &)>) const"
                     );
      }
      uVar3 = 2;
    }
    uVar3 = Instruction::GetSingleWordInOperand(this_00,uVar3);
    if (uVar3 == decoration) {
      bVar2 = std::function<bool_(const_spvtools::opt::Instruction_&)>::operator()(f,this_00);
      if (!bVar2) break;
    }
  }
  std::
  _Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  ::~_Vector_base(&local_48);
  return ppIVar4 == local_48._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool DecorationManager::WhileEachDecoration(
    uint32_t id, uint32_t decoration,
    std::function<bool(const Instruction&)> f) const {
  for (const Instruction* inst : GetDecorationsFor(id, true)) {
    switch (inst->opcode()) {
      case spv::Op::OpMemberDecorate:
        if (inst->GetSingleWordInOperand(2) == decoration) {
          if (!f(*inst)) return false;
        }
        break;
      case spv::Op::OpDecorate:
      case spv::Op::OpDecorateId:
      case spv::Op::OpDecorateStringGOOGLE:
        if (inst->GetSingleWordInOperand(1) == decoration) {
          if (!f(*inst)) return false;
        }
        break;
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
  return true;
}